

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

void __thiscall
pbrt::PiecewiseLinear2D<0UL>::PiecewiseLinear2D
          (PiecewiseLinear2D<0UL> *this,memory_resource *alloc,long data,uint xSize,int ySize,
          char param_6,char param_7)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined8 uVar20;
  byte bVar21;
  byte bVar22;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  uint uVar23;
  long lVar24;
  ulong n;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  long lVar30;
  float *pfVar31;
  ushort uVar32;
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float fVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_68;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_48;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_40;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *local_38;
  
  (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x = xSize;
  auVar42 = vpinsrd_avx(ZEXT416(xSize),ySize,1);
  (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y = ySize;
  auVar41 = vpcmpeqd_avx(in_ZMM1._0_16_,in_ZMM1._0_16_);
  auVar41 = vpaddd_avx(auVar42,auVar41);
  auVar42._8_4_ = 0x3f800000;
  auVar42._0_8_ = 0x3f8000003f800000;
  auVar42._12_4_ = 0x3f800000;
  auVar41 = vcvtdq2ps_avx(auVar41);
  auVar42 = vdivps_avx(auVar42,auVar41);
  auVar41 = vmovlhps_avx(auVar42,auVar41);
  this->m_patch_size = (Vector2f)auVar41._0_8_;
  this->m_inv_patch_size = (Vector2f)auVar41._8_8_;
  (this->m_param_values).alloc.memoryResource = alloc;
  auVar41 = ZEXT816(0) << 0x20;
  (this->m_param_values).ptr =
       (vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)auVar41._0_8_;
  (this->m_param_values).nAlloc = auVar41._8_8_;
  (this->m_param_values).nStored = 0;
  local_48 = &this->m_data;
  (this->m_data).alloc.memoryResource = alloc;
  (this->m_data).ptr = (float *)auVar41._0_8_;
  (this->m_data).nAlloc = auVar41._8_8_;
  (this->m_data).nStored = 0;
  local_38 = &this->m_marginal_cdf;
  (this->m_marginal_cdf).alloc.memoryResource = alloc;
  (this->m_marginal_cdf).ptr = (float *)auVar41._0_8_;
  (this->m_marginal_cdf).nAlloc = auVar41._8_8_;
  (this->m_marginal_cdf).nStored = 0;
  local_40 = &this->m_conditional_cdf;
  (this->m_conditional_cdf).alloc.memoryResource = alloc;
  (this->m_conditional_cdf).ptr = (float *)auVar41._0_8_;
  (this->m_conditional_cdf).nAlloc = auVar41._8_8_;
  (this->m_conditional_cdf).nStored = 0;
  if (param_7 == '\x01' && param_6 == '\0') {
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling.h"
             ,0x589,"PiecewiseLinear2D: build_cdf implies normalize=true");
  }
  n = (ulong)(ySize * xSize);
  local_68.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_68.ptr = (float *)0x0;
  local_68.nAlloc = 0;
  local_68.nStored = 0;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&local_68,n);
  if (n != 0) {
    memset(local_68.ptr,0,n * 4);
  }
  local_68.nStored = n;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(local_48,&local_68);
  local_68.nStored = 0;
  (*(local_68.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_68.alloc.memoryResource,local_68.ptr,local_68.nAlloc << 2);
  if (param_7 == '\0') {
    if (param_6 == '\0') {
      fVar39 = 1.0 / ((this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x *
                     (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y);
    }
    else {
      uVar23 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y - 1;
      if (uVar23 == 0) {
        dVar40 = 0.0;
      }
      else {
        iVar2 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
        dVar40 = 0.0;
        uVar29 = 0;
        uVar26 = 0;
        do {
          if (iVar2 != 1) {
            lVar24 = data + (long)(int)xSize * 4 + uVar29 * 4;
            lVar30 = data + uVar29 * 4;
            lVar27 = 1;
            do {
              dVar40 = dVar40 + (double)((*(float *)(lVar30 + -4 + lVar27 * 4) +
                                          *(float *)(lVar30 + lVar27 * 4) +
                                          *(float *)(lVar24 + -4 + lVar27 * 4) +
                                         *(float *)(lVar24 + lVar27 * 4)) * 0.25);
              lVar27 = lVar27 + 1;
            } while (iVar2 != (int)lVar27);
          }
          uVar26 = uVar26 + 1;
          uVar29 = (ulong)((int)uVar29 + xSize);
        } while (uVar26 != uVar23);
      }
      fVar39 = (float)(1.0 / dVar40);
    }
    if (n != 0) {
      pfVar4 = (this->m_data).ptr;
      uVar29 = 0;
      do {
        pfVar4[uVar29] = fVar39 * *(float *)(data + uVar29 * 4);
        uVar29 = uVar29 + 1;
      } while (n != uVar29);
    }
  }
  else {
    uVar29 = (ulong)(uint)(this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
    local_68.alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_68.ptr = (float *)0x0;
    local_68.nAlloc = 0;
    local_68.nStored = 0;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&local_68,uVar29);
    if (uVar29 != 0) {
      memset(local_68.ptr,0,uVar29 * 4);
    }
    local_68.nStored = uVar29;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(local_38,&local_68);
    local_68.nStored = 0;
    (*(local_68.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_68.alloc.memoryResource,local_68.ptr,local_68.nAlloc << 2,4);
    this_00 = local_40;
    local_68.alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_68.ptr = (float *)0x0;
    local_68.nAlloc = 0;
    local_68.nStored = 0;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::reserve(&local_68,n);
    if (n != 0) {
      memset(local_68.ptr,0,n * 4);
    }
    local_68.nStored = n;
    pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator=(this_00,&local_68);
    local_68.nStored = 0;
    (*(local_68.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_68.alloc.memoryResource,local_68.ptr,local_68.nAlloc << 2,4);
    pfVar4 = (this->m_marginal_cdf).ptr;
    pfVar5 = (this->m_conditional_cdf).ptr;
    pfVar6 = (this->m_data).ptr;
    iVar2 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
    lVar24 = (long)iVar2;
    if (0 < lVar24) {
      iVar3 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
      lVar27 = (long)(int)xSize;
      pfVar31 = pfVar5 + 1;
      lVar28 = 0;
      lVar30 = data;
      do {
        pfVar5[lVar28 * lVar27] = 0.0;
        if (1 < iVar3) {
          auVar41 = ZEXT816(0) << 0x40;
          lVar25 = 0;
          do {
            auVar1._8_8_ = 0;
            auVar1._0_8_ = *(ulong *)(lVar30 + lVar25 * 4);
            auVar42 = vcvtps2pd_avx(auVar1);
            auVar43._0_8_ = auVar42._0_8_ + auVar42._8_8_;
            auVar43._8_8_ = auVar42._0_8_ + auVar42._8_8_;
            auVar41 = vfmadd231sd_fma(auVar41,auVar43,ZEXT816(0x3fe0000000000000));
            pfVar31[lVar25] = (float)auVar41._0_8_;
            lVar25 = lVar25 + 1;
          } while (iVar3 + -1 != (int)lVar25);
        }
        lVar28 = lVar28 + 1;
        lVar30 = lVar30 + lVar27 * 4;
        pfVar31 = pfVar31 + lVar27;
      } while (lVar28 != lVar24);
    }
    *pfVar4 = 0.0;
    if (1 < iVar2) {
      lVar30 = (long)(int)xSize;
      auVar41 = ZEXT816(0) << 0x40;
      lVar27 = -1;
      uVar29 = 0;
      do {
        auVar44._8_8_ = 0;
        auVar44._0_8_ = (double)pfVar5[lVar30 + lVar27] + (double)pfVar5[lVar30 * 2 + lVar27];
        auVar41 = vfmadd231sd_fma(auVar41,auVar44,ZEXT816(0x3fe0000000000000));
        pfVar4[uVar29 + 1] = (float)auVar41._0_8_;
        uVar29 = uVar29 + 1;
        lVar27 = lVar27 + lVar30;
      } while (iVar2 - 1U != uVar29);
    }
    auVar41._0_4_ = 1.0 / pfVar4[(int)(iVar2 - 1U)];
    auVar41._4_12_ = SUB6012((undefined1  [60])0x0,0);
    if (n != 0) {
      auVar33 = vpbroadcastq_avx512f();
      auVar34 = vbroadcastss_avx512f(auVar41);
      uVar29 = 0;
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar37 = vpbroadcastq_avx512f();
        auVar38 = vporq_avx512f(auVar37,auVar35);
        auVar37 = vporq_avx512f(auVar37,auVar36);
        uVar20 = vpcmpuq_avx512f(auVar37,auVar33,2);
        bVar21 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar38,auVar33,2);
        bVar22 = (byte)uVar20;
        uVar32 = CONCAT11(bVar22,bVar21);
        pfVar31 = pfVar5 + uVar29;
        auVar37._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * (int)pfVar31[1];
        auVar37._0_4_ = (uint)(bVar21 & 1) * (int)*pfVar31;
        auVar37._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * (int)pfVar31[2];
        auVar37._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * (int)pfVar31[3];
        auVar37._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * (int)pfVar31[4];
        auVar37._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * (int)pfVar31[5];
        auVar37._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * (int)pfVar31[6];
        auVar37._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * (int)pfVar31[7];
        auVar37._32_4_ = (uint)(bVar22 & 1) * (int)pfVar31[8];
        auVar37._36_4_ = (uint)(bVar22 >> 1 & 1) * (int)pfVar31[9];
        auVar37._40_4_ = (uint)(bVar22 >> 2 & 1) * (int)pfVar31[10];
        auVar37._44_4_ = (uint)(bVar22 >> 3 & 1) * (int)pfVar31[0xb];
        auVar37._48_4_ = (uint)(bVar22 >> 4 & 1) * (int)pfVar31[0xc];
        auVar37._52_4_ = (uint)(bVar22 >> 5 & 1) * (int)pfVar31[0xd];
        auVar37._56_4_ = (uint)(bVar22 >> 6 & 1) * (int)pfVar31[0xe];
        auVar37._60_4_ = (uint)(bVar22 >> 7) * (int)pfVar31[0xf];
        auVar37 = vmulps_avx512f(auVar34,auVar37);
        pfVar31 = pfVar5 + uVar29;
        bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar32 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar32 >> 6) & 1);
        bVar13 = (bool)((byte)(uVar32 >> 7) & 1);
        bVar14 = (bool)(bVar22 >> 1 & 1);
        bVar15 = (bool)(bVar22 >> 2 & 1);
        bVar16 = (bool)(bVar22 >> 3 & 1);
        bVar17 = (bool)(bVar22 >> 4 & 1);
        bVar18 = (bool)(bVar22 >> 5 & 1);
        bVar19 = (bool)(bVar22 >> 6 & 1);
        *pfVar31 = (float)((uint)(bVar21 & 1) * auVar37._0_4_ |
                          (uint)!(bool)(bVar21 & 1) * (int)*pfVar31);
        pfVar31[1] = (float)((uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * (int)pfVar31[1]);
        pfVar31[2] = (float)((uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * (int)pfVar31[2]);
        pfVar31[3] = (float)((uint)bVar9 * auVar37._12_4_ | (uint)!bVar9 * (int)pfVar31[3]);
        pfVar31[4] = (float)((uint)bVar10 * auVar37._16_4_ | (uint)!bVar10 * (int)pfVar31[4]);
        pfVar31[5] = (float)((uint)bVar11 * auVar37._20_4_ | (uint)!bVar11 * (int)pfVar31[5]);
        pfVar31[6] = (float)((uint)bVar12 * auVar37._24_4_ | (uint)!bVar12 * (int)pfVar31[6]);
        pfVar31[7] = (float)((uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * (int)pfVar31[7]);
        pfVar31[8] = (float)((uint)(bVar22 & 1) * auVar37._32_4_ |
                            (uint)!(bool)(bVar22 & 1) * (int)pfVar31[8]);
        pfVar31[9] = (float)((uint)bVar14 * auVar37._36_4_ | (uint)!bVar14 * (int)pfVar31[9]);
        pfVar31[10] = (float)((uint)bVar15 * auVar37._40_4_ | (uint)!bVar15 * (int)pfVar31[10]);
        pfVar31[0xb] = (float)((uint)bVar16 * auVar37._44_4_ | (uint)!bVar16 * (int)pfVar31[0xb]);
        pfVar31[0xc] = (float)((uint)bVar17 * auVar37._48_4_ | (uint)!bVar17 * (int)pfVar31[0xc]);
        pfVar31[0xd] = (float)((uint)bVar18 * auVar37._52_4_ | (uint)!bVar18 * (int)pfVar31[0xd]);
        pfVar31[0xe] = (float)((uint)bVar19 * auVar37._56_4_ | (uint)!bVar19 * (int)pfVar31[0xe]);
        pfVar31[0xf] = (float)((uint)(bVar22 >> 7) * auVar37._60_4_ |
                              (uint)!(bool)(bVar22 >> 7) * (int)pfVar31[0xf]);
        uVar29 = uVar29 + 0x10;
      } while ((n + 0xf & 0xfffffffffffffff0) != uVar29);
    }
    if (iVar2 != 0) {
      auVar33 = vpbroadcastq_avx512f();
      auVar34 = vbroadcastss_avx512f(auVar41);
      uVar29 = 0;
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar37 = vpbroadcastq_avx512f();
        auVar38 = vporq_avx512f(auVar37,auVar35);
        auVar37 = vporq_avx512f(auVar37,auVar36);
        uVar20 = vpcmpuq_avx512f(auVar37,auVar33,2);
        bVar21 = (byte)uVar20;
        uVar20 = vpcmpuq_avx512f(auVar38,auVar33,2);
        bVar22 = (byte)uVar20;
        uVar32 = CONCAT11(bVar22,bVar21);
        pfVar5 = pfVar4 + uVar29;
        auVar38._4_4_ = (uint)((byte)(uVar32 >> 1) & 1) * (int)pfVar5[1];
        auVar38._0_4_ = (uint)(bVar21 & 1) * (int)*pfVar5;
        auVar38._8_4_ = (uint)((byte)(uVar32 >> 2) & 1) * (int)pfVar5[2];
        auVar38._12_4_ = (uint)((byte)(uVar32 >> 3) & 1) * (int)pfVar5[3];
        auVar38._16_4_ = (uint)((byte)(uVar32 >> 4) & 1) * (int)pfVar5[4];
        auVar38._20_4_ = (uint)((byte)(uVar32 >> 5) & 1) * (int)pfVar5[5];
        auVar38._24_4_ = (uint)((byte)(uVar32 >> 6) & 1) * (int)pfVar5[6];
        auVar38._28_4_ = (uint)((byte)(uVar32 >> 7) & 1) * (int)pfVar5[7];
        auVar38._32_4_ = (uint)(bVar22 & 1) * (int)pfVar5[8];
        auVar38._36_4_ = (uint)(bVar22 >> 1 & 1) * (int)pfVar5[9];
        auVar38._40_4_ = (uint)(bVar22 >> 2 & 1) * (int)pfVar5[10];
        auVar38._44_4_ = (uint)(bVar22 >> 3 & 1) * (int)pfVar5[0xb];
        auVar38._48_4_ = (uint)(bVar22 >> 4 & 1) * (int)pfVar5[0xc];
        auVar38._52_4_ = (uint)(bVar22 >> 5 & 1) * (int)pfVar5[0xd];
        auVar38._56_4_ = (uint)(bVar22 >> 6 & 1) * (int)pfVar5[0xe];
        auVar38._60_4_ = (uint)(bVar22 >> 7) * (int)pfVar5[0xf];
        auVar37 = vmulps_avx512f(auVar34,auVar38);
        pfVar5 = pfVar4 + uVar29;
        bVar7 = (bool)((byte)(uVar32 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar32 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar32 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar32 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar32 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar32 >> 6) & 1);
        bVar13 = (bool)((byte)(uVar32 >> 7) & 1);
        bVar14 = (bool)(bVar22 >> 1 & 1);
        bVar15 = (bool)(bVar22 >> 2 & 1);
        bVar16 = (bool)(bVar22 >> 3 & 1);
        bVar17 = (bool)(bVar22 >> 4 & 1);
        bVar18 = (bool)(bVar22 >> 5 & 1);
        bVar19 = (bool)(bVar22 >> 6 & 1);
        *pfVar5 = (float)((uint)(bVar21 & 1) * auVar37._0_4_ |
                         (uint)!(bool)(bVar21 & 1) * (int)*pfVar5);
        pfVar5[1] = (float)((uint)bVar7 * auVar37._4_4_ | (uint)!bVar7 * (int)pfVar5[1]);
        pfVar5[2] = (float)((uint)bVar8 * auVar37._8_4_ | (uint)!bVar8 * (int)pfVar5[2]);
        pfVar5[3] = (float)((uint)bVar9 * auVar37._12_4_ | (uint)!bVar9 * (int)pfVar5[3]);
        pfVar5[4] = (float)((uint)bVar10 * auVar37._16_4_ | (uint)!bVar10 * (int)pfVar5[4]);
        pfVar5[5] = (float)((uint)bVar11 * auVar37._20_4_ | (uint)!bVar11 * (int)pfVar5[5]);
        pfVar5[6] = (float)((uint)bVar12 * auVar37._24_4_ | (uint)!bVar12 * (int)pfVar5[6]);
        pfVar5[7] = (float)((uint)bVar13 * auVar37._28_4_ | (uint)!bVar13 * (int)pfVar5[7]);
        pfVar5[8] = (float)((uint)(bVar22 & 1) * auVar37._32_4_ |
                           (uint)!(bool)(bVar22 & 1) * (int)pfVar5[8]);
        pfVar5[9] = (float)((uint)bVar14 * auVar37._36_4_ | (uint)!bVar14 * (int)pfVar5[9]);
        pfVar5[10] = (float)((uint)bVar15 * auVar37._40_4_ | (uint)!bVar15 * (int)pfVar5[10]);
        pfVar5[0xb] = (float)((uint)bVar16 * auVar37._44_4_ | (uint)!bVar16 * (int)pfVar5[0xb]);
        pfVar5[0xc] = (float)((uint)bVar17 * auVar37._48_4_ | (uint)!bVar17 * (int)pfVar5[0xc]);
        pfVar5[0xd] = (float)((uint)bVar18 * auVar37._52_4_ | (uint)!bVar18 * (int)pfVar5[0xd]);
        pfVar5[0xe] = (float)((uint)bVar19 * auVar37._56_4_ | (uint)!bVar19 * (int)pfVar5[0xe]);
        pfVar5[0xf] = (float)((uint)(bVar22 >> 7) * auVar37._60_4_ |
                             (uint)!(bool)(bVar22 >> 7) * (int)pfVar5[0xf]);
        uVar29 = uVar29 + 0x10;
      } while ((lVar24 + 0xfU & 0xfffffffffffffff0) != uVar29);
    }
    if (ySize * xSize != 0) {
      uVar29 = 0;
      do {
        pfVar6[uVar29] = auVar41._0_4_ * *(float *)(data + uVar29 * 4);
        uVar29 = uVar29 + 1;
      } while (n != uVar29);
    }
  }
  return;
}

Assistant:

PiecewiseLinear2D(Allocator alloc, const float *data, int xSize, int ySize,
                      pstd::array<int, Dimension> param_res = {},
                      pstd::array<const float *, Dimension> param_values = {},
                      bool normalize = true, bool build_cdf = true)
        : m_size(xSize, ySize),
          m_patch_size(1.f / (xSize - 1), 1.f / (ySize - 1)),
          m_inv_patch_size(m_size - Vector2i(1, 1)),
          m_param_values(alloc),
          m_data(alloc),
          m_marginal_cdf(alloc),
          m_conditional_cdf(alloc) {
        if (build_cdf && !normalize)
            LOG_FATAL("PiecewiseLinear2D: build_cdf implies normalize=true");

        /* Keep track of the dependence on additional parameters (optional) */
        uint32_t slices = 1;
        for (int i = 0; i < ArraySize; ++i)
            m_param_values.emplace_back(alloc);
        for (int i = (int)Dimension - 1; i >= 0; --i) {
            if (param_res[i] < 1)
                LOG_FATAL("PiecewiseLinear2D(): parameter resolution must be >= 1!");

            m_param_size[i] = param_res[i];
            m_param_values[i] = FloatStorage(param_res[i]);
            memcpy(m_param_values[i].data(), param_values[i],
                   sizeof(float) * param_res[i]);
            m_param_strides[i] = param_res[i] > 1 ? slices : 0;
            slices *= m_param_size[i];
        }

        uint32_t n_values = xSize * ySize;

        m_data = FloatStorage(slices * n_values);

        if (build_cdf) {
            m_marginal_cdf = FloatStorage(slices * m_size.y);
            m_conditional_cdf = FloatStorage(slices * n_values);

            float *marginal_cdf = m_marginal_cdf.data(),
                  *conditional_cdf = m_conditional_cdf.data(), *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                /* Construct conditional CDF */
                for (int y = 0; y < m_size.y; ++y) {
                    double sum = 0.0;
                    size_t i = y * xSize;
                    conditional_cdf[i] = 0.f;
                    for (int x = 0; x < m_size.x - 1; ++x, ++i) {
                        sum += .5 * ((double)data[i] + (double)data[i + 1]);
                        conditional_cdf[i + 1] = (float)sum;
                    }
                }

                /* Construct marginal CDF */
                marginal_cdf[0] = 0.f;
                double sum = 0.0;
                for (int y = 0; y < m_size.y - 1; ++y) {
                    sum += .5 * ((double)conditional_cdf[(y + 1) * xSize - 1] +
                                 (double)conditional_cdf[(y + 2) * xSize - 1]);
                    marginal_cdf[y + 1] = (float)sum;
                }

                /* Normalize CDFs and PDF (if requested) */
                float normalization = 1.f / marginal_cdf[m_size.y - 1];
                for (size_t i = 0; i < n_values; ++i)
                    conditional_cdf[i] *= normalization;
                for (size_t i = 0; i < m_size.y; ++i)
                    marginal_cdf[i] *= normalization;
                for (size_t i = 0; i < n_values; ++i)
                    data_out[i] = data[i] * normalization;

                marginal_cdf += m_size.y;
                conditional_cdf += n_values;
                data_out += n_values;
                data += n_values;
            }
        } else {
            float *data_out = m_data.data();

            for (uint32_t slice = 0; slice < slices; ++slice) {
                float normalization = 1.f / HProd(m_inv_patch_size);
                if (normalize) {
                    double sum = 0.0;
                    for (uint32_t y = 0; y < m_size.y - 1; ++y) {
                        size_t i = y * xSize;
                        for (uint32_t x = 0; x < m_size.x - 1; ++x, ++i) {
                            float v00 = data[i], v10 = data[i + 1], v01 = data[i + xSize],
                                  v11 = data[i + 1 + xSize],
                                  avg = .25f * (v00 + v10 + v01 + v11);
                            sum += (double)avg;
                        }
                    }
                    normalization = float(1.0 / sum);
                }

                for (uint32_t k = 0; k < n_values; ++k)
                    data_out[k] = data[k] * normalization;

                data += n_values;
                data_out += n_values;
            }
        }
    }